

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  FILE *__stream;
  size_t sVar5;
  wasm_table_t *table_00;
  wasm_func_t *func;
  wasm_func_t *pwVar6;
  wasm_func_t *pwVar7;
  wasm_valtype_t *p;
  wasm_valtype_t *r;
  wasm_functype_t *pwVar8;
  undefined8 uVar9;
  ulong uVar10;
  undefined8 uVar11;
  wasm_table_t *table2;
  wasm_tabletype_t *tabletype;
  wasm_limits_t limits;
  wasm_table_t *copy;
  wasm_func_t *h;
  wasm_functype_t *neg_type;
  wasm_func_t *g;
  wasm_func_t *f;
  wasm_func_t *call_indirect;
  wasm_table_t *table;
  size_t i;
  wasm_extern_vec_t exports;
  wasm_instance_t *instance;
  wasm_extern_vec_t imports;
  wasm_module_t *module;
  wasm_byte_vec_t binary;
  size_t file_size;
  FILE *file;
  wasm_store_t *store;
  wasm_engine_t *engine;
  char **argv_local;
  int argc_local;
  
  printf("Initializing...\n");
  uVar3 = wasm_engine_new();
  uVar4 = wasm_store_new(uVar3);
  printf("Loading binary...\n");
  __stream = fopen("table.wasm","rb");
  if (__stream == (FILE *)0x0) {
    printf("> Error loading module!\n");
    argv_local._4_4_ = 1;
  }
  else {
    fseek(__stream,0,2);
    binary.data = (wasm_byte_t *)ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&module,binary.data);
    sVar5 = fread((void *)binary.size,(size_t)binary.data,1,__stream);
    if (sVar5 == 1) {
      fclose(__stream);
      printf("Compiling module...\n");
      imports.data = (wasm_extern_t **)wasm_module_new(uVar4);
      if (imports.data == (wasm_extern_t **)0x0) {
        printf("> Error compiling module!\n");
        argv_local._4_4_ = 1;
      }
      else {
        wasm_byte_vec_delete(&module);
        printf("Instantiating module...\n");
        memset(&instance,0,0x10);
        exports.data = (wasm_extern_t **)wasm_instance_new(uVar4,imports.data,&instance,0);
        if (exports.data == (wasm_extern_t **)0x0) {
          printf("> Error instantiating module!\n");
          argv_local._4_4_ = 1;
        }
        else {
          printf("Extracting exports...\n");
          wasm_instance_exports(exports.data,&i);
          table_00 = get_export_table((wasm_extern_vec_t *)&i,0);
          func = get_export_func((wasm_extern_vec_t *)&i,1);
          pwVar6 = get_export_func((wasm_extern_vec_t *)&i,2);
          pwVar7 = get_export_func((wasm_extern_vec_t *)&i,3);
          wasm_module_delete(imports.data);
          printf("Creating callback...\n");
          p = wasm_valtype_new_i32();
          r = wasm_valtype_new_i32();
          pwVar8 = wasm_functype_new_1_1(p,r);
          uVar9 = wasm_func_new(uVar4,pwVar8,neg_callback);
          wasm_functype_delete(pwVar8);
          limits = (wasm_limits_t)wasm_table_copy(table_00);
          uVar10 = wasm_table_same(table_00,limits);
          if ((uVar10 & 1) == 0) {
            __assert_fail("wasm_table_same(table, copy)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/table.c"
                          ,0x8d,"int main(int, const char **)");
          }
          wasm_table_delete(limits);
          printf("Checking table...\n");
          iVar2 = wasm_table_size(table_00);
          check(iVar2 == 2);
          check_table(table_00,0,false);
          check_table(table_00,1,true);
          check_trap(func,0,0);
          check_call(func,7,1,7);
          check_trap(func,0,2);
          printf("Mutating table...\n");
          uVar11 = wasm_func_as_ref(pwVar7);
          bVar1 = wasm_table_set(table_00,0,uVar11);
          check((_Bool)(bVar1 & 1));
          bVar1 = wasm_table_set(table_00,1,0);
          check((_Bool)(bVar1 & 1));
          uVar11 = wasm_func_as_ref(pwVar6);
          bVar1 = wasm_table_set(table_00,2,uVar11);
          check((_Bool)((bVar1 ^ 0xff) & 1));
          check_table(table_00,0,true);
          check_table(table_00,1,false);
          check_call(func,7,0,0x29a);
          check_trap(func,0,1);
          check_trap(func,0,2);
          printf("Growing table...\n");
          bVar1 = wasm_table_grow(table_00,3,0);
          check((_Bool)(bVar1 & 1));
          iVar2 = wasm_table_size(table_00);
          check(iVar2 == 5);
          uVar11 = wasm_func_as_ref(pwVar6);
          bVar1 = wasm_table_set(table_00,2,uVar11);
          check((_Bool)(bVar1 & 1));
          uVar11 = wasm_func_as_ref(uVar9);
          bVar1 = wasm_table_set(table_00,3,uVar11);
          check((_Bool)(bVar1 & 1));
          bVar1 = wasm_table_set(table_00,5,0);
          check((_Bool)((bVar1 ^ 0xff) & 1));
          check_table(table_00,2,true);
          check_table(table_00,3,true);
          check_table(table_00,4,false);
          check_call(func,5,2,5);
          check_call(func,6,3,-6);
          check_trap(func,0,4);
          check_trap(func,0,5);
          uVar11 = wasm_func_as_ref(pwVar6);
          bVar1 = wasm_table_grow(table_00,2,uVar11);
          check((_Bool)(bVar1 & 1));
          iVar2 = wasm_table_size(table_00);
          check(iVar2 == 7);
          check_table(table_00,5,true);
          check_table(table_00,6,true);
          bVar1 = wasm_table_grow(table_00,5,0);
          check((_Bool)((bVar1 ^ 0xff) & 1));
          bVar1 = wasm_table_grow(table_00,3,0);
          check((_Bool)(bVar1 & 1));
          bVar1 = wasm_table_grow(table_00,0,0);
          check((_Bool)(bVar1 & 1));
          wasm_func_delete(uVar9);
          wasm_extern_vec_delete(&i);
          wasm_instance_delete(exports.data);
          printf("Creating stand-alone table...\n");
          tabletype = (wasm_tabletype_t *)0x500000005;
          uVar9 = wasm_valtype_new(0x81);
          uVar9 = wasm_tabletype_new(uVar9,&tabletype);
          uVar11 = wasm_table_new(uVar4,uVar9,0);
          iVar2 = wasm_table_size(uVar11);
          check(iVar2 == 5);
          bVar1 = wasm_table_grow(uVar11,1,0);
          check((_Bool)((bVar1 ^ 0xff) & 1));
          bVar1 = wasm_table_grow(uVar11,0,0);
          check((_Bool)(bVar1 & 1));
          wasm_tabletype_delete(uVar9);
          wasm_table_delete(uVar11);
          printf("Shutting down...\n");
          wasm_store_delete(uVar4);
          wasm_engine_delete(uVar3);
          printf("Done.\n");
          argv_local._4_4_ = 0;
        }
      }
    }
    else {
      printf("> Error loading module!\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("table.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_vec_t imports = WASM_EMPTY_VEC;
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  size_t i = 0;
  wasm_table_t* table = get_export_table(&exports, i++);
  wasm_func_t* call_indirect = get_export_func(&exports, i++);
  wasm_func_t* f = get_export_func(&exports, i++);
  wasm_func_t* g = get_export_func(&exports, i++);

  wasm_module_delete(module);

  // Create external function.
  printf("Creating callback...\n");
  own wasm_functype_t* neg_type = wasm_functype_new_1_1(wasm_valtype_new_i32(), wasm_valtype_new_i32());
  own wasm_func_t* h = wasm_func_new(store, neg_type, neg_callback);

  wasm_functype_delete(neg_type);

  // Try cloning.
  own wasm_table_t* copy = wasm_table_copy(table);
  assert(wasm_table_same(table, copy));
  wasm_table_delete(copy);

  // Check initial table.
  printf("Checking table...\n");
  check(wasm_table_size(table) == 2);
  check_table(table, 0, false);
  check_table(table, 1, true);
  check_trap(call_indirect, 0, 0);
  check_call(call_indirect, 7, 1, 7);
  check_trap(call_indirect, 0, 2);

  // Mutate table.
  printf("Mutating table...\n");
  check(wasm_table_set(table, 0, wasm_func_as_ref(g)));
  check(wasm_table_set(table, 1, NULL));
  check(! wasm_table_set(table, 2, wasm_func_as_ref(f)));
  check_table(table, 0, true);
  check_table(table, 1, false);
  check_call(call_indirect, 7, 0, 666);
  check_trap(call_indirect, 0, 1);
  check_trap(call_indirect, 0, 2);

  // Grow table.
  printf("Growing table...\n");
  check(wasm_table_grow(table, 3, NULL));
  check(wasm_table_size(table) == 5);
  check(wasm_table_set(table, 2, wasm_func_as_ref(f)));
  check(wasm_table_set(table, 3, wasm_func_as_ref(h)));
  check(! wasm_table_set(table, 5, NULL));
  check_table(table, 2, true);
  check_table(table, 3, true);
  check_table(table, 4, false);
  check_call(call_indirect, 5, 2, 5);
  check_call(call_indirect, 6, 3, -6);
  check_trap(call_indirect, 0, 4);
  check_trap(call_indirect, 0, 5);

  check(wasm_table_grow(table, 2, wasm_func_as_ref(f)));
  check(wasm_table_size(table) == 7);
  check_table(table, 5, true);
  check_table(table, 6, true);

  check(! wasm_table_grow(table, 5, NULL));
  check(wasm_table_grow(table, 3, NULL));
  check(wasm_table_grow(table, 0, NULL));

  wasm_func_delete(h);
  wasm_extern_vec_delete(&exports);
  wasm_instance_delete(instance);

  // Create stand-alone table.
  // TODO(wasm+): Once Wasm allows multiple tables, turn this into import.
  printf("Creating stand-alone table...\n");
  wasm_limits_t limits = {5, 5};
  own wasm_tabletype_t* tabletype =
    wasm_tabletype_new(wasm_valtype_new(WASM_FUNCREF), &limits);
  own wasm_table_t* table2 = wasm_table_new(store, tabletype, NULL);
  check(wasm_table_size(table2) == 5);
  check(! wasm_table_grow(table2, 1, NULL));
  check(wasm_table_grow(table2, 0, NULL));

  wasm_tabletype_delete(tabletype);
  wasm_table_delete(table2);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}